

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O0

void gf256_muladd_mem(void *vz,uint8_t y,void *vx,int bytes)

{
  __m256i *palVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  __m256i alVar14;
  __m256i alVar15;
  __m256i alVar16;
  __m256i alVar17;
  __m256i alVar18;
  __m256i alVar19;
  __m128i alVar20;
  __m128i alVar21;
  __m128i alVar22;
  __m128i alVar23;
  __m128i alVar24;
  __m128i alVar25;
  uint uVar26;
  ulong *puVar27;
  ulong *puVar28;
  __m128i *palVar29;
  long lVar30;
  uint in_ECX;
  uint uVar31;
  uint uVar32;
  undefined1 (*in_RDX) [32];
  byte in_SIL;
  ulong *in_RDI;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int offset;
  uint32_t word_1;
  uint32_t *z4;
  int four;
  uint64_t word;
  uint64_t *z8;
  uint8_t *table;
  uint8_t *x1;
  uint8_t *z1;
  __m128i z0_3;
  __m128i p0_3;
  __m128i h0_3;
  __m128i l0_3;
  __m128i x0_3;
  __m128i p0_2;
  __m128i p1_1;
  __m128i z0_2;
  __m128i h0_2;
  __m128i l0_2;
  __m128i x0_2;
  __m128i z1_2;
  __m128i h1_1;
  __m128i l1_1;
  __m128i x1_2;
  __m128i clr_mask_1;
  __m128i table_hi_y_1;
  __m128i table_lo_y_1;
  __m256i z0_1;
  __m256i p0_1;
  __m256i h0_1;
  __m256i l0_1;
  __m256i x0_1;
  __m256i p1;
  __m256i h1;
  __m256i z1_1;
  __m256i l1;
  __m256i x1_1;
  __m256i p0;
  __m256i h0;
  __m256i z0;
  __m256i l0;
  __m256i x0;
  uint i;
  uint count;
  __m256i *x32;
  __m256i *z32;
  __m256i clr_mask;
  __m256i table_hi_y;
  __m256i table_lo_y;
  __m128i *x16;
  __m128i *z16;
  undefined1 (*local_e10) [32];
  ulong *local_e08;
  ulong local_de0;
  ulong uStackY_dd8;
  ulong local_dd0;
  ulong uStackY_dc8;
  ulong local_d80;
  ulong uStackY_d78;
  ulong local_d70;
  ulong uStackY_d68;
  ulong local_d40;
  ulong uStackY_d38;
  ulong local_d30;
  ulong uStackY_d28;
  ulong local_ca0;
  ulong uStackY_c98;
  ulong uStackY_c90;
  ulong uStackY_c88;
  ulong local_c80;
  ulong uStackY_c78;
  ulong uStackY_c70;
  ulong uStackY_c68;
  undefined1 in_stack_fffffffffffff3a0 [32];
  void *in_stack_fffffffffffff3c0;
  ulong local_c20;
  ulong uStack_c18;
  ulong uStack_c10;
  ulong uStack_c08;
  ulong local_be0;
  ulong uStack_bd8;
  ulong uStack_bd0;
  ulong uStack_bc8;
  ulong local_b80;
  ulong uStack_b78;
  ulong uStack_b70;
  ulong uStack_b68;
  ulong local_b40;
  ulong uStack_b38;
  ulong uStack_b30;
  ulong uStack_b28;
  uint local_af8;
  undefined1 (*local_af0) [32];
  ulong *local_ae8;
  undefined1 (*local_a70) [32];
  ulong *local_a68;
  uint local_a5c;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  if (in_SIL < 2) {
    if (in_SIL == 1) {
      gf256_add_mem(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3a0._24_8_,
                    in_stack_fffffffffffff3a0._20_4_);
    }
  }
  else {
    local_a70 = in_RDX;
    local_a68 = in_RDI;
    local_a5c = in_ECX;
    if ((0x1f < (int)in_ECX) && (CpuHasAVX2)) {
      palVar1 = GF256Ctx.MM256.TABLE_LO_Y + in_SIL;
      alVar18 = *palVar1;
      alVar16 = *palVar1;
      alVar14 = *palVar1;
      palVar1 = GF256Ctx.MM256.TABLE_HI_Y + in_SIL;
      alVar19 = *palVar1;
      alVar17 = *palVar1;
      alVar15 = *palVar1;
      auVar34 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
      auVar34 = vpinsrb_avx(auVar34,0xf,2);
      auVar34 = vpinsrb_avx(auVar34,0xf,3);
      auVar34 = vpinsrb_avx(auVar34,0xf,4);
      auVar34 = vpinsrb_avx(auVar34,0xf,5);
      auVar34 = vpinsrb_avx(auVar34,0xf,6);
      auVar34 = vpinsrb_avx(auVar34,0xf,7);
      auVar34 = vpinsrb_avx(auVar34,0xf,8);
      auVar34 = vpinsrb_avx(auVar34,0xf,9);
      auVar34 = vpinsrb_avx(auVar34,0xf,10);
      auVar34 = vpinsrb_avx(auVar34,0xf,0xb);
      auVar34 = vpinsrb_avx(auVar34,0xf,0xc);
      auVar34 = vpinsrb_avx(auVar34,0xf,0xd);
      auVar34 = vpinsrb_avx(auVar34,0xf,0xe);
      auVar34 = vpinsrb_avx(auVar34,0xf,0xf);
      auVar33 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
      auVar33 = vpinsrb_avx(auVar33,0xf,2);
      auVar33 = vpinsrb_avx(auVar33,0xf,3);
      auVar33 = vpinsrb_avx(auVar33,0xf,4);
      auVar33 = vpinsrb_avx(auVar33,0xf,5);
      auVar33 = vpinsrb_avx(auVar33,0xf,6);
      auVar33 = vpinsrb_avx(auVar33,0xf,7);
      auVar33 = vpinsrb_avx(auVar33,0xf,8);
      auVar33 = vpinsrb_avx(auVar33,0xf,9);
      auVar33 = vpinsrb_avx(auVar33,0xf,10);
      auVar33 = vpinsrb_avx(auVar33,0xf,0xb);
      auVar33 = vpinsrb_avx(auVar33,0xf,0xc);
      auVar33 = vpinsrb_avx(auVar33,0xf,0xd);
      auVar33 = vpinsrb_avx(auVar33,0xf,0xe);
      auVar33 = vpinsrb_avx(auVar33,0xf,0xf);
      auVar33 = ZEXT116(0) * auVar34 + ZEXT116(1) * auVar33;
      auVar34 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar34;
      uStack_90 = auVar34._0_8_;
      uStack_88 = auVar34._8_8_;
      uVar26 = (int)in_ECX / 0x40;
      for (local_af8 = 0; local_af8 < uVar26; local_af8 = local_af8 + 1) {
        auVar6._16_8_ = uStack_90;
        auVar6._0_16_ = auVar33;
        auVar6._24_8_ = uStack_88;
        auVar5 = vpand_avx2(in_RDX[local_af8 << 1],auVar6);
        auVar6 = vpsrlq_avx2(in_RDX[local_af8 << 1],ZEXT416(4));
        puVar27 = in_RDI + (ulong)(local_af8 << 1) * 4;
        uVar7 = puVar27[1];
        uVar8 = puVar27[2];
        uVar9 = puVar27[3];
        auVar13._16_8_ = uStack_90;
        auVar13._0_16_ = auVar33;
        auVar13._24_8_ = uStack_88;
        auVar6 = vpand_avx2(auVar6,auVar13);
        auVar5 = vpshufb_avx2((undefined1  [32])alVar14,auVar5);
        auVar6 = vpshufb_avx2((undefined1  [32])alVar15,auVar6);
        local_b40 = auVar5._0_8_;
        uStack_b38 = auVar5._8_8_;
        uStack_b30 = auVar5._16_8_;
        uStack_b28 = auVar5._24_8_;
        local_b80 = auVar6._0_8_;
        uStack_b78 = auVar6._8_8_;
        uStack_b70 = auVar6._16_8_;
        uStack_b68 = auVar6._24_8_;
        puVar28 = in_RDI + (ulong)(local_af8 << 1) * 4;
        *puVar28 = local_b40 ^ local_b80 ^ *puVar27;
        puVar28[1] = uStack_b38 ^ uStack_b78 ^ uVar7;
        puVar28[2] = uStack_b30 ^ uStack_b70 ^ uVar8;
        puVar28[3] = uStack_b28 ^ uStack_b68 ^ uVar9;
        auVar5._16_8_ = uStack_90;
        auVar5._0_16_ = auVar33;
        auVar5._24_8_ = uStack_88;
        auVar5 = vpand_avx2(in_RDX[(ulong)(local_af8 << 1) + 1],auVar5);
        auVar6 = vpsrlq_avx2(in_RDX[(ulong)(local_af8 << 1) + 1],ZEXT416(4));
        uVar31 = local_af8 << 1;
        uVar7 = in_RDI[(ulong)uVar31 * 4 + 5];
        uVar8 = in_RDI[(ulong)uVar31 * 4 + 6];
        uVar9 = in_RDI[(ulong)uVar31 * 4 + 7];
        auVar12._16_8_ = uStack_90;
        auVar12._0_16_ = auVar33;
        auVar12._24_8_ = uStack_88;
        auVar6 = vpand_avx2(auVar6,auVar12);
        auVar5 = vpshufb_avx2((undefined1  [32])alVar16,auVar5);
        auVar6 = vpshufb_avx2((undefined1  [32])alVar17,auVar6);
        local_be0 = auVar5._0_8_;
        uStack_bd8 = auVar5._8_8_;
        uStack_bd0 = auVar5._16_8_;
        uStack_bc8 = auVar5._24_8_;
        local_c20 = auVar6._0_8_;
        uStack_c18 = auVar6._8_8_;
        uStack_c10 = auVar6._16_8_;
        uStack_c08 = auVar6._24_8_;
        uVar32 = local_af8 << 1;
        in_RDI[(ulong)uVar32 * 4 + 4] = local_be0 ^ local_c20 ^ in_RDI[(ulong)uVar31 * 4 + 4];
        in_RDI[(ulong)uVar32 * 4 + 5] = uStack_bd8 ^ uStack_c18 ^ uVar7;
        in_RDI[(ulong)uVar32 * 4 + 6] = uStack_bd0 ^ uStack_c10 ^ uVar8;
        in_RDI[(ulong)uVar32 * 4 + 7] = uStack_bc8 ^ uStack_c08 ^ uVar9;
      }
      local_a5c = (int)in_ECX % 0x40;
      local_ae8 = in_RDI + (ulong)(uVar26 << 1) * 4;
      local_af0 = in_RDX + (uVar26 << 1);
      if (0x1f < (int)local_a5c) {
        auVar11._16_8_ = uStack_90;
        auVar11._0_16_ = auVar33;
        auVar11._24_8_ = uStack_88;
        auVar5 = vpand_avx2(*local_af0,auVar11);
        auVar6 = vpsrlq_avx2(*local_af0,ZEXT416(4));
        auVar10._16_8_ = uStack_90;
        auVar10._0_16_ = auVar33;
        auVar10._24_8_ = uStack_88;
        auVar6 = vpand_avx2(auVar6,auVar10);
        auVar5 = vpshufb_avx2((undefined1  [32])alVar18,auVar5);
        auVar6 = vpshufb_avx2((undefined1  [32])alVar19,auVar6);
        local_c80 = auVar5._0_8_;
        uStackY_c78 = auVar5._8_8_;
        uStackY_c70 = auVar5._16_8_;
        uStackY_c68 = auVar5._24_8_;
        local_ca0 = auVar6._0_8_;
        uStackY_c98 = auVar6._8_8_;
        uStackY_c90 = auVar6._16_8_;
        uStackY_c88 = auVar6._24_8_;
        *local_ae8 = local_c80 ^ local_ca0 ^ *local_ae8;
        local_ae8[1] = uStackY_c78 ^ uStackY_c98 ^ local_ae8[1];
        local_ae8[2] = uStackY_c70 ^ uStackY_c90 ^ local_ae8[2];
        local_ae8[3] = uStackY_c68 ^ uStackY_c88 ^ local_ae8[3];
        local_a5c = local_a5c - 0x20;
        local_ae8 = local_ae8 + 4;
        local_af0 = local_af0 + 1;
      }
      local_a68 = local_ae8;
      local_a70 = local_af0;
    }
    if ((0xf < (int)local_a5c) && ((CpuHasSSSE3 & 1U) != 0)) {
      palVar29 = GF256Ctx.MM128.TABLE_LO_Y + in_SIL;
      alVar24 = *palVar29;
      alVar22 = *palVar29;
      alVar20 = *palVar29;
      palVar29 = GF256Ctx.MM128.TABLE_HI_Y + in_SIL;
      alVar25 = *palVar29;
      alVar23 = *palVar29;
      alVar21 = *palVar29;
      auVar34 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
      auVar34 = vpinsrb_avx(auVar34,0xf,2);
      auVar34 = vpinsrb_avx(auVar34,0xf,3);
      auVar34 = vpinsrb_avx(auVar34,0xf,4);
      auVar34 = vpinsrb_avx(auVar34,0xf,5);
      auVar34 = vpinsrb_avx(auVar34,0xf,6);
      auVar34 = vpinsrb_avx(auVar34,0xf,7);
      auVar34 = vpinsrb_avx(auVar34,0xf,8);
      auVar34 = vpinsrb_avx(auVar34,0xf,9);
      auVar34 = vpinsrb_avx(auVar34,0xf,10);
      auVar34 = vpinsrb_avx(auVar34,0xf,0xb);
      auVar34 = vpinsrb_avx(auVar34,0xf,0xc);
      auVar34 = vpinsrb_avx(auVar34,0xf,0xd);
      auVar34 = vpinsrb_avx(auVar34,0xf,0xe);
      auVar34 = vpinsrb_avx(auVar34,0xf,0xf);
      while (0x1f < (int)local_a5c) {
        local_a5c = local_a5c - 0x20;
        auVar33 = vpand_avx(*(undefined1 (*) [16])(*local_a70 + 0x10),auVar34);
        auVar4 = vpsrlq_avx(*(undefined1 (*) [16])(*local_a70 + 0x10),ZEXT416(4));
        auVar4 = vpand_avx(auVar4,auVar34);
        auVar2 = vpshufb_avx((undefined1  [16])alVar20,auVar33);
        auVar3 = vpshufb_avx((undefined1  [16])alVar21,auVar4);
        auVar33 = vpand_avx(*(undefined1 (*) [16])*local_a70,auVar34);
        auVar4 = vpsrlq_avx(*(undefined1 (*) [16])*local_a70,ZEXT416(4));
        auVar4 = vpand_avx(auVar4,auVar34);
        auVar33 = vpshufb_avx((undefined1  [16])alVar22,auVar33);
        auVar4 = vpshufb_avx((undefined1  [16])alVar23,auVar4);
        local_d30 = auVar2._0_8_;
        uStackY_d28 = auVar2._8_8_;
        local_d40 = auVar3._0_8_;
        uStackY_d38 = auVar3._8_8_;
        local_a68[2] = local_d30 ^ local_d40 ^ local_a68[2];
        local_a68[3] = uStackY_d28 ^ uStackY_d38 ^ local_a68[3];
        local_d70 = auVar33._0_8_;
        uStackY_d68 = auVar33._8_8_;
        local_d80 = auVar4._0_8_;
        uStackY_d78 = auVar4._8_8_;
        *local_a68 = local_d70 ^ local_d80 ^ *local_a68;
        local_a68[1] = uStackY_d68 ^ uStackY_d78 ^ local_a68[1];
        local_a70 = local_a70 + 1;
        local_a68 = local_a68 + 4;
      }
      for (; 0xf < (int)local_a5c; local_a5c = local_a5c - 0x10) {
        auVar33 = vpand_avx(*(undefined1 (*) [16])*local_a70,auVar34);
        auVar4 = vpsrlq_avx(*(undefined1 (*) [16])*local_a70,ZEXT416(4));
        auVar4 = vpand_avx(auVar4,auVar34);
        auVar33 = vpshufb_avx((undefined1  [16])alVar24,auVar33);
        auVar4 = vpshufb_avx((undefined1  [16])alVar25,auVar4);
        local_dd0 = auVar33._0_8_;
        uStackY_dc8 = auVar33._8_8_;
        local_de0 = auVar4._0_8_;
        uStackY_dd8 = auVar4._8_8_;
        *local_a68 = local_dd0 ^ local_de0 ^ *local_a68;
        local_a68[1] = uStackY_dc8 ^ uStackY_dd8 ^ local_a68[1];
        local_a70 = (undefined1 (*) [32])(*local_a70 + 0x10);
        local_a68 = local_a68 + 2;
      }
    }
    local_e08 = local_a68;
    local_e10 = local_a70;
    lVar30 = (ulong)in_SIL * 0x100 + 0x2bc460;
    for (; 7 < (int)local_a5c; local_a5c = local_a5c - 8) {
      *local_e08 = CONCAT17(*(undefined1 *)(lVar30 + (ulong)(byte)(*local_e10)[7]),
                            CONCAT16(*(undefined1 *)(lVar30 + (ulong)(byte)(*local_e10)[6]),
                                     CONCAT15(*(undefined1 *)(lVar30 + (ulong)(byte)(*local_e10)[5])
                                              ,CONCAT14(*(undefined1 *)
                                                         (lVar30 + (ulong)(byte)(*local_e10)[4]),
                                                        CONCAT13(*(undefined1 *)
                                                                  (lVar30 + (ulong)(byte)(*local_e10
                                                                                         )[3]),
                                                                 CONCAT12(*(undefined1 *)
                                                                           (lVar30 + (ulong)(byte)(*
                                                  local_e10)[2]),
                                                  CONCAT11(*(undefined1 *)
                                                            (lVar30 + (ulong)(byte)(*local_e10)[1]),
                                                           *(undefined1 *)
                                                            (lVar30 + (ulong)(byte)(*local_e10)[0]))
                                                  )))))) ^ *local_e08;
      local_e10 = (undefined1 (*) [32])(*local_e10 + 8);
      local_e08 = local_e08 + 1;
    }
    uVar26 = local_a5c & 4;
    if (uVar26 != 0) {
      *(uint *)local_e08 =
           CONCAT13(*(undefined1 *)(lVar30 + (ulong)(byte)(*local_e10)[3]),
                    CONCAT12(*(undefined1 *)(lVar30 + (ulong)(byte)(*local_e10)[2]),
                             CONCAT11(*(undefined1 *)(lVar30 + (ulong)(byte)(*local_e10)[1]),
                                      *(undefined1 *)(lVar30 + (ulong)(byte)(*local_e10)[0])))) ^
           (uint)*local_e08;
    }
    local_a5c = local_a5c & 3;
    if (local_a5c != 1) {
      if (local_a5c != 2) {
        if (local_a5c != 3) {
          return;
        }
        *(byte *)((long)local_e08 + (long)(int)(uVar26 + 2)) =
             *(byte *)((long)local_e08 + (long)(int)(uVar26 + 2)) ^
             *(byte *)(lVar30 + (ulong)(byte)(*local_e10)[(int)(uVar26 + 2)]);
      }
      *(byte *)((long)local_e08 + (long)(int)(uVar26 + 1)) =
           *(byte *)((long)local_e08 + (long)(int)(uVar26 + 1)) ^
           *(byte *)(lVar30 + (ulong)(byte)(*local_e10)[(int)(uVar26 + 1)]);
    }
    *(byte *)((long)local_e08 + (long)(int)uVar26) =
         *(byte *)((long)local_e08 + (long)(int)uVar26) ^
         *(byte *)(lVar30 + (ulong)(byte)(*local_e10)[(int)uVar26]);
  }
  return;
}

Assistant:

void gf256_muladd_mem(void * GF256_RESTRICT vz, uint8_t y,
                                 const void * GF256_RESTRICT vx, int bytes)
{
    // Use a single if-statement to handle special cases
    if (y <= 1)
    {
        if (y == 1)
            gf256_add_mem(vz, vx, bytes);
        return;
    }

    GF256_M128 * GF256_RESTRICT z16 = reinterpret_cast<GF256_M128 *>(vz);
    const GF256_M128 * GF256_RESTRICT x16 = reinterpret_cast<const GF256_M128 *>(vx);

#if defined(GF256_TARGET_MOBILE)
#if defined(GF256_TRY_NEON)
    if (bytes >= 16 && CpuHasNeon)
    {
        // Partial product tables; see above
        const GF256_M128 table_lo_y = vld1q_u8((uint8_t*)(GF256Ctx.MM128.TABLE_LO_Y + y));
        const GF256_M128 table_hi_y = vld1q_u8((uint8_t*)(GF256Ctx.MM128.TABLE_HI_Y + y));

        // clr_mask = 0x0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f
        const GF256_M128 clr_mask = vdupq_n_u8(0x0f);

        // Handle multiples of 16 bytes
        do
        {
            // See above comments for details
            GF256_M128 x0 = vld1q_u8((uint8_t*)x16);
            GF256_M128 l0 = vandq_u8(x0, clr_mask);

            // x0 = vshrq_n_u8(x0, 4);
            x0 = (GF256_M128)vshrq_n_u64( (uint64x2_t)x0, 4);
            GF256_M128 h0 = vandq_u8(x0, clr_mask);
            l0 = vqtbl1q_u8(table_lo_y, l0);
            h0 = vqtbl1q_u8(table_hi_y, h0);
            const GF256_M128 p0 = veorq_u8(l0, h0);
            const GF256_M128 z0 = vld1q_u8((uint8_t*)z16);
            vst1q_u8((uint8_t*)z16, veorq_u8(p0, z0));
            bytes -= 16, ++x16, ++z16;
        } while (bytes >= 16);
    }
#endif
#else // GF256_TARGET_MOBILE
# if defined(GF256_TRY_AVX2)
    if (bytes >= 32 && CpuHasAVX2)
    {
        // Partial product tables; see above
        const GF256_M256 table_lo_y = _mm256_loadu_si256(GF256Ctx.MM256.TABLE_LO_Y + y);
        const GF256_M256 table_hi_y = _mm256_loadu_si256(GF256Ctx.MM256.TABLE_HI_Y + y);

        // clr_mask = 0x0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f
        const GF256_M256 clr_mask = _mm256_set1_epi8(0x0f);

        GF256_M256 * GF256_RESTRICT z32 = reinterpret_cast<GF256_M256 *>(z16);
        const GF256_M256 * GF256_RESTRICT x32 = reinterpret_cast<const GF256_M256 *>(x16);

        // On my Reed Solomon codec, the encoder unit test runs in 640 usec without and 550 usec with the optimization (86% of the original time)
        const unsigned count = bytes / 64;
        for (unsigned i = 0; i < count; ++i)
        {
            // See above comments for details
            GF256_M256 x0 = _mm256_loadu_si256(x32 + i * 2);
            GF256_M256 l0 = _mm256_and_si256(x0, clr_mask);
            x0 = _mm256_srli_epi64(x0, 4);
            const GF256_M256 z0 = _mm256_loadu_si256(z32 + i * 2);
            GF256_M256 h0 = _mm256_and_si256(x0, clr_mask);
            l0 = _mm256_shuffle_epi8(table_lo_y, l0);
            h0 = _mm256_shuffle_epi8(table_hi_y, h0);
            const GF256_M256 p0 = _mm256_xor_si256(l0, h0);
            _mm256_storeu_si256(z32 + i * 2, _mm256_xor_si256(p0, z0));

            GF256_M256 x1 = _mm256_loadu_si256(x32 + i * 2 + 1);
            GF256_M256 l1 = _mm256_and_si256(x1, clr_mask);
            x1 = _mm256_srli_epi64(x1, 4);
            const GF256_M256 z1 = _mm256_loadu_si256(z32 + i * 2 + 1);
            GF256_M256 h1 = _mm256_and_si256(x1, clr_mask);
            l1 = _mm256_shuffle_epi8(table_lo_y, l1);
            h1 = _mm256_shuffle_epi8(table_hi_y, h1);
            const GF256_M256 p1 = _mm256_xor_si256(l1, h1);
            _mm256_storeu_si256(z32 + i * 2 + 1, _mm256_xor_si256(p1, z1));
        }
        bytes -= count * 64;
        z32 += count * 2;
        x32 += count * 2;

        if (bytes >= 32)
        {
            GF256_M256 x0 = _mm256_loadu_si256(x32);
            GF256_M256 l0 = _mm256_and_si256(x0, clr_mask);
            x0 = _mm256_srli_epi64(x0, 4);
            GF256_M256 h0 = _mm256_and_si256(x0, clr_mask);
            l0 = _mm256_shuffle_epi8(table_lo_y, l0);
            h0 = _mm256_shuffle_epi8(table_hi_y, h0);
            const GF256_M256 p0 = _mm256_xor_si256(l0, h0);
            const GF256_M256 z0 = _mm256_loadu_si256(z32);
            _mm256_storeu_si256(z32, _mm256_xor_si256(p0, z0));

            bytes -= 32;
            z32++;
            x32++;
        }

        z16 = reinterpret_cast<GF256_M128 *>(z32);
        x16 = reinterpret_cast<const GF256_M128 *>(x32);
    }
# endif // GF256_TRY_AVX2
    if (bytes >= 16 && CpuHasSSSE3)
    {
        // Partial product tables; see above
        const GF256_M128 table_lo_y = _mm_loadu_si128(GF256Ctx.MM128.TABLE_LO_Y + y);
        const GF256_M128 table_hi_y = _mm_loadu_si128(GF256Ctx.MM128.TABLE_HI_Y + y);

        // clr_mask = 0x0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f
        const GF256_M128 clr_mask = _mm_set1_epi8(0x0f);

        // This unroll seems to provide about 7% speed boost when AVX2 is disabled
        while (bytes >= 32)
        {
            bytes -= 32;

            GF256_M128 x1 = _mm_loadu_si128(x16 + 1);
            GF256_M128 l1 = _mm_and_si128(x1, clr_mask);
            x1 = _mm_srli_epi64(x1, 4);
            GF256_M128 h1 = _mm_and_si128(x1, clr_mask);
            l1 = _mm_shuffle_epi8(table_lo_y, l1);
            h1 = _mm_shuffle_epi8(table_hi_y, h1);
            const GF256_M128 z1 = _mm_loadu_si128(z16 + 1);

            GF256_M128 x0 = _mm_loadu_si128(x16);
            GF256_M128 l0 = _mm_and_si128(x0, clr_mask);
            x0 = _mm_srli_epi64(x0, 4);
            GF256_M128 h0 = _mm_and_si128(x0, clr_mask);
            l0 = _mm_shuffle_epi8(table_lo_y, l0);
            h0 = _mm_shuffle_epi8(table_hi_y, h0);
            const GF256_M128 z0 = _mm_loadu_si128(z16);

            const GF256_M128 p1 = _mm_xor_si128(l1, h1);
            _mm_storeu_si128(z16 + 1, _mm_xor_si128(p1, z1));

            const GF256_M128 p0 = _mm_xor_si128(l0, h0);
            _mm_storeu_si128(z16, _mm_xor_si128(p0, z0));

            x16 += 2, z16 += 2;
        }

        // Handle multiples of 16 bytes
        while (bytes >= 16)
        {
            // See above comments for details
            GF256_M128 x0 = _mm_loadu_si128(x16);
            GF256_M128 l0 = _mm_and_si128(x0, clr_mask);
            x0 = _mm_srli_epi64(x0, 4);
            GF256_M128 h0 = _mm_and_si128(x0, clr_mask);
            l0 = _mm_shuffle_epi8(table_lo_y, l0);
            h0 = _mm_shuffle_epi8(table_hi_y, h0);
            const GF256_M128 p0 = _mm_xor_si128(l0, h0);
            const GF256_M128 z0 = _mm_loadu_si128(z16);
            _mm_storeu_si128(z16, _mm_xor_si128(p0, z0));

            bytes -= 16, ++x16, ++z16;
        }
    }
#endif // GF256_TARGET_MOBILE

    uint8_t * GF256_RESTRICT z1 = reinterpret_cast<uint8_t*>(z16);
    const uint8_t * GF256_RESTRICT x1 = reinterpret_cast<const uint8_t*>(x16);
    const uint8_t * GF256_RESTRICT table = GF256Ctx.GF256_MUL_TABLE + ((unsigned)y << 8);

    // Handle blocks of 8 bytes
    while (bytes >= 8)
    {
        uint64_t * GF256_RESTRICT z8 = reinterpret_cast<uint64_t *>(z1);
#ifdef GF256_IS_BIG_ENDIAN
        uint64_t word = (uint64_t)table[x1[0]] << 56;
        word |= (uint64_t)table[x1[1]] << 48;
        word |= (uint64_t)table[x1[2]] << 40;
        word |= (uint64_t)table[x1[3]] << 32;
        word |= (uint64_t)table[x1[4]] << 24;
        word |= (uint64_t)table[x1[5]] << 16;
        word |= (uint64_t)table[x1[6]] << 8;
        word |= (uint64_t)table[x1[7]];
#else
        uint64_t word = table[x1[0]];
        word |= (uint64_t)table[x1[1]] << 8;
        word |= (uint64_t)table[x1[2]] << 16;
        word |= (uint64_t)table[x1[3]] << 24;
        word |= (uint64_t)table[x1[4]] << 32;
        word |= (uint64_t)table[x1[5]] << 40;
        word |= (uint64_t)table[x1[6]] << 48;
        word |= (uint64_t)table[x1[7]] << 56;
#endif
        *z8 ^= word;

        bytes -= 8, x1 += 8, z1 += 8;
    }

    // Handle a block of 4 bytes
    const int four = bytes & 4;
    if (four)
    {
        uint32_t * GF256_RESTRICT z4 = reinterpret_cast<uint32_t *>(z1);
#ifdef GF256_IS_BIG_ENDIAN
        uint32_t word = (uint32_t)table[x1[0]] << 24;
        word |= (uint32_t)table[x1[1]] << 16;
        word |= (uint32_t)table[x1[2]] << 8;
        word |= (uint32_t)table[x1[3]];
#else
        uint32_t word = table[x1[0]];
        word |= (uint32_t)table[x1[1]] << 8;
        word |= (uint32_t)table[x1[2]] << 16;
        word |= (uint32_t)table[x1[3]] << 24;
#endif
        *z4 ^= word;
    }

    // Handle single bytes
    const int offset = four;
    switch (bytes & 3)
    {
    case 3: z1[offset + 2] ^= table[x1[offset + 2]];
    case 2: z1[offset + 1] ^= table[x1[offset + 1]];
    case 1: z1[offset] ^= table[x1[offset]];
    default:
        break;
    }
}